

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamWriter.h
# Opt level: O1

void __thiscall
Assimp::StreamWriter<false,_false>::Put<short>(StreamWriter<false,_false> *this,short f)

{
  size_type __new_size;
  
  __new_size = this->cursor + 2;
  if ((ulong)((long)(this->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start) <= __new_size) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->buffer,__new_size);
  }
  *(short *)((this->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start + this->cursor) = f;
  this->cursor = this->cursor + 2;
  return;
}

Assistant:

void Put(T f)   {
        Intern :: Getter<SwapEndianess,T,RuntimeSwitch>() (&f, le);

        if (cursor + sizeof(T) >= buffer.size()) {
            buffer.resize(cursor + sizeof(T));
        }

        void* dest = &buffer[cursor];

        // reinterpret_cast + assignment breaks strict aliasing rules
        // and generally causes trouble on platforms such as ARM that
        // do not silently ignore alignment faults.
        ::memcpy(dest, &f, sizeof(T));
        cursor += sizeof(T);
    }